

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.cpp
# Opt level: O3

int Pattern_match(Pattern *p,vector<StateP,_std::allocator<StateP>_> *stk)

{
  int *piVar1;
  pointer pSVar2;
  int iVar3;
  
  switch(*(undefined4 *)p) {
  case 0:
    iVar3 = P_Char_match<P_CharAny>((P_CharAny *)p,stk);
    return iVar3;
  case 1:
    iVar3 = P_Char_match<P_CharOut>((P_CharOut *)p,stk);
    return iVar3;
  case 2:
    iVar3 = P_Char_match<P_CharExact>((P_CharExact *)p,stk);
    return iVar3;
  case 3:
    iVar3 = P_Char_match<P_CharNegative>((P_CharNegative *)p,stk);
    return iVar3;
  case 4:
    pSVar2 = (stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    *(P_Sequence **)(p + 0x20) = pSVar2[-1].seq;
    *(int *)(p + 0x28) = pSVar2[-1].iseq;
    pSVar2[-1].seq = (P_Sequence *)p;
    pSVar2[-1].iseq = 0;
    break;
  case 5:
    P_Alternation::match((P_Alternation *)p,stk);
    break;
  case 6:
    P_Assertion::match((P_Assertion *)p,stk);
    break;
  case 7:
    P_DirectionAlternation::match((P_DirectionAlternation *)p,stk);
    break;
  case 8:
    P_Teleport::match((P_Teleport *)p,stk);
    break;
  case 9:
    return 1;
  case 10:
    piVar1 = &(stk->super__Vector_base<StateP,_std::allocator<StateP>_>)._M_impl.
              super__Vector_impl_data._M_finish[-1].iseq;
    *piVar1 = *piVar1 + *(int *)(p + 4);
    break;
  case 0xb:
    P_Quantifier::match((P_Quantifier *)p,stk);
    break;
  case 0xc:
    P_QReset::match((P_QReset *)p,stk);
    break;
  default:
    __assert_fail("!\"This is not supposed to happen\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/feresum[P]PMA/snails/pattern.cpp"
                  ,0xc,"int Pattern_match(Pattern *, vector<StateP> &)");
  }
  return 0;
}

Assistant:

int Pattern_match(Pattern* p, vector<StateP>& stk) {
#define PATTERN_DISPATCH(PTYPE) case PType::PTYPE: return reinterpret_cast<PTYPE*>(p)->match(stk);
    PType type = *reinterpret_cast<PType*>(p);
    switch (type) {
        PTYPE_LIST_APPLY(PATTERN_DISPATCH)
    }
    NEVERHAPPEN
}